

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

void sptk::world::Harvest
               (double *x,int x_length,int fs,HarvestOption *option,double *temporal_positions,
               double *f0)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  void *pvVar7;
  void *pvVar8;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long in_R8;
  long in_R9;
  int i;
  int f0_length;
  double *basic_temporal_positions;
  double *basic_f0;
  int basic_f0_length;
  int basic_frame_period;
  double channels_in_octave;
  int dimension_ratio;
  double target_fs;
  double in_stack_00000088;
  int in_stack_00000094;
  int in_stack_00000098;
  int in_stack_0000009c;
  double *in_stack_000000a0;
  double *in_stack_000000b0;
  undefined4 local_60;
  
  matlab_round((double)in_EDX / 8000.0);
  if ((*(double *)(in_RCX + 0x10) != 1.0) || (NAN(*(double *)(in_RCX + 0x10)))) {
    iVar3 = GetSamplesForHarvest(in_EDX,in_ESI,1.0);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)iVar3;
    uVar6 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    pvVar7 = operator_new__(uVar6);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)iVar3;
    uVar6 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    pvVar8 = operator_new__(uVar6);
    anon_unknown_2::HarvestGeneralBody
              (in_stack_000000a0,in_stack_0000009c,in_stack_00000098,in_stack_00000094,
               in_stack_00000088,(double)x,(double)CONCAT44(x_length,fs),option._4_4_,
               (double)temporal_positions,f0,in_stack_000000b0);
    iVar4 = GetSamplesForHarvest(in_EDX,in_ESI,*(double *)(in_RCX + 0x10));
    for (local_60 = 0; local_60 < iVar4; local_60 = local_60 + 1) {
      *(double *)(in_R8 + (long)local_60 * 8) =
           ((double)local_60 * *(double *)(in_RCX + 0x10)) / 1000.0;
      iVar5 = matlab_round(*(double *)(in_R8 + (long)local_60 * 8) * 1000.0);
      iVar5 = MyMinInt(iVar3 + -1,iVar5);
      *(undefined8 *)(in_R9 + (long)local_60 * 8) = *(undefined8 *)((long)pvVar7 + (long)iVar5 * 8);
    }
    if (pvVar7 != (void *)0x0) {
      operator_delete__(pvVar7);
    }
    if (pvVar8 != (void *)0x0) {
      operator_delete__(pvVar8);
    }
  }
  else {
    anon_unknown_2::HarvestGeneralBody
              (in_stack_000000a0,in_stack_0000009c,in_stack_00000098,in_stack_00000094,
               in_stack_00000088,(double)x,(double)CONCAT44(x_length,fs),option._4_4_,
               (double)temporal_positions,f0,in_stack_000000b0);
  }
  return;
}

Assistant:

void Harvest(const double *x, int x_length, int fs,
    const HarvestOption *option, double *temporal_positions, double *f0) {
  // Several parameters will be controllable for debug.
  double target_fs = 8000.0;
  int dimension_ratio = matlab_round(fs / target_fs);
  double channels_in_octave = 40;

  if (option->frame_period == 1.0) {
    HarvestGeneralBody(x, x_length, fs, 1, option->f0_floor,
        option->f0_ceil, channels_in_octave, dimension_ratio,
#if 0
        temporal_positions, f0);
#else
        option->allowed_range, temporal_positions, f0);
#endif
    return;
  }

  int basic_frame_period = 1;
  int basic_f0_length =
    GetSamplesForHarvest(fs, x_length, basic_frame_period);
  double *basic_f0 = new double[basic_f0_length];
  double *basic_temporal_positions = new double[basic_f0_length];
  HarvestGeneralBody(x, x_length, fs, basic_frame_period, option->f0_floor,
      option->f0_ceil, channels_in_octave, dimension_ratio,
#if 0
      basic_temporal_positions, basic_f0);
#else
      option->allowed_range, basic_temporal_positions, basic_f0);
#endif

  int f0_length = GetSamplesForHarvest(fs, x_length, option->frame_period);
  for (int i = 0; i < f0_length; ++i) {
    temporal_positions[i] = i * option->frame_period / 1000.0;
    f0[i] = basic_f0[MyMinInt(basic_f0_length - 1,
      matlab_round(temporal_positions[i] * 1000.0))];
  }

  delete[] basic_f0;
  delete[] basic_temporal_positions;
}